

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.hpp
# Opt level: O2

void DeleteMatrix(SparseMatrix *A)

{
  SparseMatrix_STRUCT *this;
  local_int_t i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < A->localNumberOfRows; lVar1 = lVar1 + 1) {
    if (A->matrixValues[lVar1] != (double *)0x0) {
      operator_delete__(A->matrixValues[lVar1]);
    }
    if (A->mtxIndG[lVar1] != (global_int_t *)0x0) {
      operator_delete__(A->mtxIndG[lVar1]);
    }
    if (A->mtxIndL[lVar1] != (local_int_t *)0x0) {
      operator_delete__(A->mtxIndL[lVar1]);
    }
  }
  if (A->title != (char *)0x0) {
    operator_delete__(A->title);
  }
  if (A->nonzerosInRow != (char *)0x0) {
    operator_delete__(A->nonzerosInRow);
  }
  if (A->mtxIndG != (global_int_t **)0x0) {
    operator_delete__(A->mtxIndG);
  }
  if (A->mtxIndL != (local_int_t **)0x0) {
    operator_delete__(A->mtxIndL);
  }
  if (A->matrixValues != (double **)0x0) {
    operator_delete__(A->matrixValues);
  }
  if (A->matrixDiagonal != (double **)0x0) {
    operator_delete__(A->matrixDiagonal);
  }
  if (A->geom != (Geometry *)0x0) {
    DeleteGeometry(A->geom);
    operator_delete(A->geom,0x80);
    A->geom = (Geometry *)0x0;
  }
  if (A->Ac != (SparseMatrix *)0x0) {
    DeleteMatrix(A->Ac);
    this = A->Ac;
    if (this != (SparseMatrix_STRUCT *)0x0) {
      SparseMatrix_STRUCT::~SparseMatrix_STRUCT(this);
    }
    operator_delete(this,200);
    A->Ac = (SparseMatrix_STRUCT *)0x0;
  }
  if (A->mgData != (MGData *)0x0) {
    DeleteMGData(A->mgData);
    operator_delete(A->mgData,0x30);
    A->mgData = (MGData *)0x0;
  }
  return;
}

Assistant:

inline void DeleteMatrix(SparseMatrix & A) {

#ifndef HPCG_CONTIGUOUS_ARRAYS
  for (local_int_t i = 0; i< A.localNumberOfRows; ++i) {
    delete [] A.matrixValues[i];
    delete [] A.mtxIndG[i];
    delete [] A.mtxIndL[i];
  }
#else
  delete [] A.matrixValues[0];
  delete [] A.mtxIndG[0];
  delete [] A.mtxIndL[0];
#endif
  if (A.title)                  delete [] A.title;
  if (A.nonzerosInRow)             delete [] A.nonzerosInRow;
  if (A.mtxIndG) delete [] A.mtxIndG;
  if (A.mtxIndL) delete [] A.mtxIndL;
  if (A.matrixValues) delete [] A.matrixValues;
  if (A.matrixDiagonal)           delete [] A.matrixDiagonal;

#ifndef HPCG_NO_MPI
  if (A.elementsToSend)       delete [] A.elementsToSend;
  if (A.neighbors)              delete [] A.neighbors;
  if (A.receiveLength)            delete [] A.receiveLength;
  if (A.sendLength)            delete [] A.sendLength;
  if (A.sendBuffer)            delete [] A.sendBuffer;
#endif

  if (A.geom!=0) { DeleteGeometry(*A.geom); delete A.geom; A.geom = 0;}
  if (A.Ac!=0) { DeleteMatrix(*A.Ac); delete A.Ac; A.Ac = 0;} // Delete coarse matrix
  if (A.mgData!=0) { DeleteMGData(*A.mgData); delete A.mgData; A.mgData = 0;} // Delete MG data
  return;
}